

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void r_code::Utils::SetString(Atom *iptr,string *s)

{
  char *pcVar1;
  Atom local_44;
  Atom local_40;
  byte local_3a;
  byte local_39;
  uint32_t uStack_38;
  uint8_t i;
  int8_t shift;
  uint64_t _st;
  Atom local_20;
  byte local_1a;
  byte local_19;
  uint8_t index;
  string *psStack_18;
  uint8_t l;
  string *s_local;
  Atom *iptr_local;
  
  psStack_18 = s;
  s_local = (string *)iptr;
  local_19 = std::__cxx11::string::length();
  local_1a = 0;
  Atom::String(&local_20,local_19);
  Atom::operator=((Atom *)(s_local + (ulong)local_1a * 4),&local_20);
  Atom::~Atom(&local_20);
  _uStack_38 = 0;
  local_39 = 0;
  for (local_3a = 0; local_3a < local_19; local_3a = local_3a + 1) {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
    _uStack_38 = (long)((int)*pcVar1 << (local_39 & 0x1f)) | _uStack_38;
    local_39 = local_39 + 8;
    if (local_39 == 0x40) {
      Atom::Atom(&local_40,uStack_38);
      local_1a = local_1a + 1;
      Atom::operator=((Atom *)(s_local + (ulong)local_1a * 4),&local_40);
      Atom::~Atom(&local_40);
      _uStack_38 = 0;
      local_39 = 0;
    }
  }
  if ((uint)local_19 % 4 != 0) {
    Atom::Atom(&local_44,uStack_38);
    local_1a = local_1a + 1;
    Atom::operator=((Atom *)(s_local + (ulong)local_1a * 4),&local_44);
    Atom::~Atom(&local_44);
  }
  return;
}

Assistant:

void Utils::SetString(Atom *iptr, const std::string &s)
{
    uint8_t l = (uint8_t)s.length();
    uint8_t index = 0;
    iptr[index] = Atom::String(l);
    uint64_t _st = 0;
    int8_t shift = 0;

    for (uint8_t i = 0; i < l; ++i) {
        _st |= s[i] << shift;
        shift += 8;

        if (shift == 64) {
            iptr[++index] = _st;
            _st = 0;
            shift = 0;
        }
    }

    if (l % 4) {
        iptr[++index] = _st;
    }
}